

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool room_build(chunk *c,wchar_t by0,wchar_t bx0,room_profile profile,_Bool finds_own_space)

{
  int *piVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  _Bool _Var4;
  loc_conflict lVar5;
  loc lVar6;
  int iVar7;
  long lVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  
  wVar9 = dun->block_hgt;
  wVar10 = dun->block_wid;
  event_signal_string(EVENT_GEN_ROOM_START,profile.name);
  if ((profile.level <= c->depth) &&
     ((dun->pit_num < (int)(uint)z_info->level_pit_max || (profile.pit == false)))) {
    wVar2 = dun->block_hgt;
    wVar3 = dun->block_wid;
    wVar9 = (profile.height / wVar9 + by0 + 1) - (uint)(profile.height % wVar2 == 0);
    wVar10 = (profile.width / wVar10 + bx0 + 1) - (uint)(profile.width % wVar3 == 0);
    if (finds_own_space) {
      lVar5 = loc(c->width,c->height);
      _Var4 = (*profile.builder)(c,lVar5,profile.rating);
      if (_Var4) {
LAB_0014fe72:
        _Var4 = true;
        if (profile.pit != true) goto LAB_0014fd2c;
        iVar7 = 1;
        lVar8 = 0x78;
        _Var4 = true;
LAB_0014fe9d:
        piVar1 = (int *)((long)&dun->profile + lVar8);
        *piVar1 = *piVar1 + iVar7;
        goto LAB_0014fd2c;
      }
    }
    else {
      _Var4 = check_for_unreserved_blocks(by0,bx0,wVar9,wVar10);
      if (_Var4) {
        lVar6 = (loc)loc(((wVar10 + bx0 + 1) * wVar3) / 2,((by0 + wVar9 + 1) * wVar2) / 2);
        if (dun->cent_n < (int)(uint)z_info->level_room_max) {
          dun->cent[dun->cent_n] = lVar6;
          dun->cent_n = dun->cent_n + L'\x01';
        }
        _Var4 = (*profile.builder)(c,(loc_conflict)lVar6,profile.rating);
        if (_Var4) {
          reserve_blocks(by0,bx0,wVar9,wVar10);
          goto LAB_0014fe72;
        }
        iVar7 = -1;
        lVar8 = 8;
        _Var4 = false;
        goto LAB_0014fe9d;
      }
    }
  }
  _Var4 = false;
LAB_0014fd2c:
  event_signal_flag(EVENT_GEN_ROOM_END,_Var4);
  return _Var4;
}

Assistant:

bool room_build(struct chunk *c, int by0, int bx0, struct room_profile profile,
	bool finds_own_space)
{
	/* Extract blocks */
	int by1 = by0;
	int bx1 = bx0;
	int by2 = by0 + profile.height / dun->block_hgt;
	int bx2 = bx0 + profile.width / dun->block_wid;

	struct loc centre;

	event_signal_string(EVENT_GEN_ROOM_START, profile.name);
	/* Enforce the room profile's minimum depth */
	if (c->depth < profile.level) {
		event_signal_flag(EVENT_GEN_ROOM_END, false);
		return false;
	}

	/* Only allow at most two pit/nests room per level */
	if ((dun->pit_num >= z_info->level_pit_max) && (profile.pit)) {
		event_signal_flag(EVENT_GEN_ROOM_END, false);
		return false;
	}

	/* Expand the number of blocks if we might overflow */
	if (profile.height % dun->block_hgt) by2++;
	if (profile.width % dun->block_wid) bx2++;

	/* Does the profile allocate space, or the room find it? */
	if (finds_own_space) {
		/* Try to build a room, pass silly place so room finds its own */
		if (!profile.builder(c, loc(c->width, c->height),
				profile.rating)) {
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}
	} else {
		if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) {
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}

		/* Get the location of the room */
		centre = loc(((bx1 + bx2 + 1) * dun->block_wid) / 2,
					 ((by1 + by2 + 1) * dun->block_hgt) / 2);

		/* Save the room location (must be before builder call to
		 * properly store entrance information). */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = centre;
			dun->cent_n++;
		}

		/* Try to build a room */
		if (!profile.builder(c, centre, profile.rating)) {
			--dun->cent_n;
			event_signal_flag(EVENT_GEN_ROOM_END, false);
			return false;
		}

		reserve_blocks(by1, bx1, by2, bx2);
	}

	/* Count pit/nests rooms */
	if (profile.pit) dun->pit_num++;

	/* Success */
	event_signal_flag(EVENT_GEN_ROOM_END, true);
	return true;
}